

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieCec.c
# Opt level: O1

void Abc_NtkDfsBoxes_rec(Abc_Obj_t *pNode,Vec_Ptr_t *vNodes)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  Abc_Ntk_t *pAVar3;
  long *plVar4;
  uint uVar5;
  int *piVar6;
  void **ppvVar7;
  Abc_Obj_t *pAVar8;
  int in_EDX;
  int Fill;
  long lVar9;
  int iVar10;
  long lVar11;
  
  uVar5 = *(uint *)&pNode->field_0x14 & 0xf;
  if (uVar5 == 2) {
    return;
  }
  if ((uVar5 != 7) && (uVar5 != 10 && (*(uint *)&pNode->field_0x14 & 0xe) != 8)) {
    __assert_fail("Abc_ObjIsNode(pNode) || Abc_ObjIsBox(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHieCec.c"
                  ,0x51,"void Abc_NtkDfsBoxes_rec(Abc_Obj_t *, Vec_Ptr_t *)");
  }
  pAVar2 = pNode->pNtk;
  iVar10 = pNode->Id;
  Vec_IntFillExtra(&pAVar2->vTravIds,iVar10 + 1,in_EDX);
  if (((long)iVar10 < 0) || ((pAVar2->vTravIds).nSize <= iVar10)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  pAVar3 = pNode->pNtk;
  iVar1 = pAVar3->nTravIds;
  if ((pAVar2->vTravIds).pArray[iVar10] == iVar1) {
    return;
  }
  iVar10 = pNode->Id;
  Vec_IntFillExtra(&pAVar3->vTravIds,iVar10 + 1,Fill);
  if (((long)iVar10 < 0) || ((pAVar3->vTravIds).nSize <= iVar10)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  (pAVar3->vTravIds).pArray[iVar10] = iVar1;
  if (0 < (pNode->vFanins).nSize) {
    lVar11 = 0;
    lVar9 = 0;
    do {
      uVar5 = *(uint *)&pNode->field_0x14 & 0xf;
      if ((*(uint *)&pNode->field_0x14 & 0xe) == 8 || uVar5 == 10) {
        pAVar8 = (Abc_Obj_t *)
                 pNode->pNtk->vObjs->pArray[*(int *)((long)(pNode->vFanins).pArray + lVar11)];
        piVar6 = (pAVar8->vFanins).pArray;
      }
      else {
        if ((uVar5 | 4) != 7) {
          __assert_fail("Abc_ObjIsPo(pObj) || Abc_ObjIsNode(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHieCec.c"
                        ,0x38,"Abc_Obj_t *Abc_ObjFaninReal(Abc_Obj_t *, int)");
        }
        piVar6 = (int *)((long)(pNode->vFanins).pArray + lVar11);
        pAVar8 = pNode;
      }
      plVar4 = (long *)pAVar8->pNtk->vObjs->pArray[*piVar6];
      pAVar8 = *(Abc_Obj_t **)
                (*(long *)(*(long *)(*plVar4 + 0x20) + 8) + (long)*(int *)plVar4[4] * 8);
      if ((*(uint *)&pAVar8->field_0x14 & 0xf) == 5) {
        pAVar8 = (Abc_Obj_t *)pAVar8->pNtk->vObjs->pArray[*(pAVar8->vFanins).pArray];
      }
      Abc_NtkDfsBoxes_rec(pAVar8,vNodes);
      lVar9 = lVar9 + 1;
      lVar11 = lVar11 + 4;
    } while (lVar9 < (pNode->vFanins).nSize);
  }
  uVar5 = vNodes->nCap;
  if (vNodes->nSize == uVar5) {
    if ((int)uVar5 < 0x10) {
      if (vNodes->pArray == (void **)0x0) {
        ppvVar7 = (void **)malloc(0x80);
      }
      else {
        ppvVar7 = (void **)realloc(vNodes->pArray,0x80);
      }
      vNodes->pArray = ppvVar7;
      iVar10 = 0x10;
    }
    else {
      iVar10 = uVar5 * 2;
      if (iVar10 <= (int)uVar5) goto LAB_0085b988;
      if (vNodes->pArray == (void **)0x0) {
        ppvVar7 = (void **)malloc((ulong)uVar5 << 4);
      }
      else {
        ppvVar7 = (void **)realloc(vNodes->pArray,(ulong)uVar5 << 4);
      }
      vNodes->pArray = ppvVar7;
    }
    vNodes->nCap = iVar10;
  }
LAB_0085b988:
  iVar10 = vNodes->nSize;
  vNodes->nSize = iVar10 + 1;
  vNodes->pArray[iVar10] = pNode;
  return;
}

Assistant:

void Abc_NtkDfsBoxes_rec( Abc_Obj_t * pNode, Vec_Ptr_t * vNodes )
{
    Abc_Obj_t * pFanin;
    int i;
    if ( Abc_ObjIsPi(pNode) )
        return;
    assert( Abc_ObjIsNode(pNode) || Abc_ObjIsBox(pNode) );
    // if this node is already visited, skip
    if ( Abc_NodeIsTravIdCurrent( pNode ) )
        return;
    Abc_NodeSetTravIdCurrent( pNode );
    // visit the transitive fanin of the node
    Abc_ObjForEachFaninReal( pNode, pFanin, i )
        Abc_NtkDfsBoxes_rec( pFanin, vNodes );
    // add the node after the fanins have been added
    Vec_PtrPush( vNodes, pNode );
}